

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool mkvparser::PrimaryChromaticity::Parse
               (IMkvReader *reader,longlong read_pos,longlong value_size,bool is_x,
               PrimaryChromaticity **chromaticity)

{
  PrimaryChromaticity *pPVar1;
  long lVar2;
  double parser_value;
  double local_30;
  
  if (reader == (IMkvReader *)0x0) {
    return false;
  }
  if (*chromaticity == (PrimaryChromaticity *)0x0) {
    pPVar1 = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
    if (pPVar1 == (PrimaryChromaticity *)0x0) {
      pPVar1 = (PrimaryChromaticity *)0x0;
    }
    else {
      pPVar1->x = 0.0;
      pPVar1->y = 0.0;
    }
    *chromaticity = pPVar1;
  }
  pPVar1 = *chromaticity;
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    local_30 = 0.0;
    lVar2 = UnserializeFloat(reader,read_pos,value_size,&local_30);
    if (lVar2 < 0) {
      return false;
    }
    if (local_30 < 0.0) {
      return false;
    }
    if (1.0 < local_30) {
      return false;
    }
    if ((local_30 <= 0.0) || (1.1754943508222875e-38 <= local_30)) {
      (&pPVar1->x)[!is_x] = (float)local_30;
      return true;
    }
  }
  return false;
}

Assistant:

bool PrimaryChromaticity::Parse(IMkvReader* reader, long long read_pos,
                                long long value_size, bool is_x,
                                PrimaryChromaticity** chromaticity) {
  if (!reader)
    return false;

  if (!*chromaticity)
    *chromaticity = new (std::nothrow) PrimaryChromaticity();

  if (!*chromaticity)
    return false;

  PrimaryChromaticity* pc = *chromaticity;
  float* value = is_x ? &pc->x : &pc->y;

  double parser_value = 0;
  const long long parse_status =
      UnserializeFloat(reader, read_pos, value_size, parser_value);

  // Valid range is [0, 1]. Make sure the double is representable as a float
  // before casting.
  if (parse_status < 0 || parser_value < 0.0 || parser_value > 1.0 ||
      (parser_value > 0.0 && parser_value < FLT_MIN))
    return false;

  *value = static_cast<float>(parser_value);

  return true;
}